

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O3

void __thiscall
fasttext::Dictionary::computeSubwords
          (Dictionary *this,string *word,vector<int,_std::allocator<int>_> *ngrams,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *substrings)

{
  char *pcVar1;
  element_type *peVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  size_type sVar7;
  ulong uVar8;
  string ngram;
  value_type local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  uVar4 = word->_M_string_length;
  if (uVar4 != 0) {
    uVar5 = 0;
    local_40 = substrings;
    local_38 = ngrams;
    do {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      local_60._M_string_length = 0;
      local_60.field_2._M_local_buf[0] = '\0';
      if (uVar5 < uVar4) {
        if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            maxn != 0) {
          uVar8 = 1;
          uVar6 = uVar5;
          do {
            std::__cxx11::string::push_back((char)&local_60);
            uVar6 = uVar6 + 1;
            peVar2 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            if ((ulong)(long)peVar2->minn <= uVar8) {
              if ((uVar8 != 1) || (uVar5 != 0 && uVar6 != word->_M_string_length)) {
                if (local_60._M_string_length == 0) {
                  uVar3 = 0x811c9dc5;
                }
                else {
                  uVar3 = 0x811c9dc5;
                  sVar7 = 0;
                  do {
                    pcVar1 = local_60._M_dataplus._M_p + sVar7;
                    sVar7 = sVar7 + 1;
                    uVar3 = ((int)*pcVar1 ^ uVar3) * 0x1000193;
                  } while (local_60._M_string_length != sVar7);
                }
                pushHash(this,local_38,uVar3 % (uint)peVar2->bucket);
                if (local_40 !=
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x0) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(local_40,&local_60);
                }
              }
            }
            uVar4 = word->_M_string_length;
          } while ((uVar6 < uVar4) &&
                  (uVar8 = uVar8 + 1,
                  uVar8 <= (ulong)(long)((this->args_).
                                         super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->maxn));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,
                          CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                   local_60.field_2._M_local_buf[0]) + 1);
          uVar4 = word->_M_string_length;
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar4);
  }
  return;
}

Assistant:

void Dictionary::computeSubwords(
    const std::string& word,
    std::vector<int32_t>& ngrams,
    std::vector<std::string>* substrings) const {
  for (size_t i = 0; i < word.size(); i++) {
    std::string ngram;
    if ((word[i] & 0xC0) == 0x80) {
      continue;
    }
    for (size_t j = i, n = 1; j < word.size() && n <= args_->maxn; n++) {
      ngram.push_back(word[j++]);
      while (j < word.size() && (word[j] & 0xC0) == 0x80) {
        ngram.push_back(word[j++]);
      }
      if (n >= args_->minn && !(n == 1 && (i == 0 || j == word.size()))) {
        int32_t h = hash(ngram) % args_->bucket;
        pushHash(ngrams, h);
        if (substrings) {
          substrings->push_back(ngram);
        }
      }
    }
  }
}